

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naming.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::rust::GetFullyQualifiedPath<google::protobuf::EnumDescriptor>
          (string *__return_storage_ptr__,rust *this,Context *ctx,EnumDescriptor *desc)

{
  bool bVar1;
  Context *ctx_00;
  AlphaNum local_168;
  AlphaNum local_138;
  string local_108;
  AlphaNum local_e8;
  undefined4 local_b4;
  AlphaNum local_b0;
  AlphaNum local_80;
  undefined1 local_40 [8];
  string rel_path;
  EnumDescriptor *desc_local;
  Context *ctx_local;
  
  rel_path.field_2._8_8_ = ctx;
  GetCrateRelativeQualifiedPath_abi_cxx11_((string *)local_40,this,ctx,desc);
  bVar1 = IsInCurrentlyGeneratingCrate((Context *)this,(EnumDescriptor *)rel_path.field_2._8_8_);
  if (bVar1) {
    absl::lts_20240722::AlphaNum::AlphaNum(&local_80,"crate::");
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_80);
  }
  else {
    ctx_00 = (Context *)EnumDescriptor::file((EnumDescriptor *)rel_path.field_2._8_8_);
    GetCrateName_abi_cxx11_(&local_108,this,ctx_00,(FileDescriptor *)desc);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_e8,&local_108);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_138,"::");
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_168,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_e8,&local_138);
    std::__cxx11::string::~string((string *)&local_108);
  }
  local_b4 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFullyQualifiedPath(Context& ctx, const Desc& desc) {
  auto rel_path = GetCrateRelativeQualifiedPath(ctx, desc);
  if (IsInCurrentlyGeneratingCrate(ctx, desc)) {
    return absl::StrCat("crate::", rel_path);
  }
  return absl::StrCat(GetCrateName(ctx, *desc.file()), "::", rel_path);
}